

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferPrecision.cpp
# Opt level: O2

GLboolean __thiscall
glcts::TextureBufferPrecision::verifyShaderCompilationStatus
          (TextureBufferPrecision *this,GLenum shader_type,char **sh_code_parts,GLuint parts_count,
          GLint expected_status)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLsizei info_log_length;
  GLint compilation_status;
  char *shader_code_ptr;
  string shader_code;
  long lVar4;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(lVar4 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not create program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xd8);
  GVar2 = (**(code **)(lVar4 + 0x3f0))(shader_type);
  this->m_sh_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not create shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xdb);
  TestCaseBase::specializeShader_abi_cxx11_
            (&shader_code,&this->super_TestCaseBase,parts_count,sh_code_parts);
  shader_code_ptr = shader_code._M_dataplus._M_p;
  (**(code **)(lVar4 + 0x12b8))(this->m_sh_id,1,&shader_code_ptr,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not set shader source",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xe0);
  (**(code **)(lVar4 + 0x248))(this->m_sh_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Failed to perform compilation of shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xe3);
  (**(code **)(lVar4 + 0xa70))(this->m_sh_id,0x8b81);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not retrieve shader compilation status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xe8);
  if (expected_status != 0) {
    (**(code **)(lVar4 + 0xa70))(this->m_sh_id,0x8b84);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not get shader info log length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                    ,0xf0);
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar4 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_sh_id != 0) {
    (**(code **)(lVar4 + 0x470))();
    this->m_sh_id = 0;
  }
  std::__cxx11::string::~string((string *)&shader_code);
  return expected_status == 0;
}

Assistant:

glw::GLboolean TextureBufferPrecision::verifyShaderCompilationStatus(glw::GLenum	   shader_type,
																	 const char**	  sh_code_parts,
																	 const glw::GLuint parts_count,
																	 const glw::GLint  expected_status)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLboolean test_passed = true;

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create program object");

	m_sh_id = gl.createShader(shader_type);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object");

	std::string shader_code		= specializeShader(parts_count, sh_code_parts);
	const char* shader_code_ptr = shader_code.c_str();
	gl.shaderSource(m_sh_id, 1, &shader_code_ptr, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set shader source");

	gl.compileShader(m_sh_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to perform compilation of shader object");

	/* Retrieving compilation status */
	glw::GLint compilation_status = GL_FALSE;
	gl.getShaderiv(m_sh_id, GL_COMPILE_STATUS, &compilation_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve shader compilation status");

	if (compilation_status != expected_status)
	{
		test_passed = false;

		glw::GLsizei info_log_length = 0;
		gl.getShaderiv(m_sh_id, GL_INFO_LOG_LENGTH, &info_log_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get shader info log length");

		if (info_log_length > 0)
		{
			glw::GLchar* info_log = new glw::GLchar[info_log_length];
			memset(info_log, 0, info_log_length * sizeof(glw::GLchar));
			gl.getShaderInfoLog(m_sh_id, info_log_length, DE_NULL, info_log);

			m_testCtx.getLog() << tcu::TestLog::Message << "The following shader:\n\n"
							   << shader_code << "\n\n did compile with result different than expected:\n"
							   << expected_status << "\n\n Compilation info log: \n"
							   << info_log << "\n"
							   << tcu::TestLog::EndMessage;

			delete[] info_log;

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get shader info log");
		}
	}

	/* Clean up */
	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (m_sh_id != 0)
	{
		gl.deleteShader(m_sh_id);
		m_sh_id = 0;
	}

	return test_passed;
}